

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

void lydict_clean(ly_dict *dict)

{
  uchar *puVar1;
  uint uVar2;
  ly_ht *ht;
  ly_ht_hlist *plVar3;
  ulong uVar4;
  
  if (dict != (ly_dict *)0x0) {
    ht = dict->hash_tab;
    for (uVar4 = 0; uVar4 < ht->size; uVar4 = uVar4 + 1) {
      plVar3 = ht->hlists + uVar4;
      while (plVar3->first != 0xffffffff) {
        puVar1 = ht->recs;
        uVar2 = plVar3->first * (uint)ht->rec_size;
        ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
               "String \"%s\" not freed from the dictionary, refcount %u.",
               *(undefined8 *)(puVar1 + (ulong)uVar2 + 8),
               (ulong)*(uint *)(puVar1 + (ulong)uVar2 + 0x10));
        ht = dict->hash_tab;
        plVar3 = (ly_ht_hlist *)(puVar1 + (ulong)uVar2 + 4);
      }
    }
    lyht_free(ht,(_func_void_void_ptr *)0x0);
    pthread_mutex_destroy((pthread_mutex_t *)&dict->lock);
    return;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","dict","lydict_clean");
  return;
}

Assistant:

void
lydict_clean(struct ly_dict *dict)
{
    struct ly_dict_rec *dict_rec = NULL;
    struct ly_ht_rec *rec = NULL;
    uint32_t hlist_idx;
    uint32_t rec_idx;

    LY_CHECK_ARG_RET(NULL, dict, );

    LYHT_ITER_ALL_RECS(dict->hash_tab, hlist_idx, rec_idx, rec) {
        /*
         * this should not happen, all records inserted into
         * dictionary are supposed to be removed using lydict_remove()
         * before calling lydict_clean()
         */
        dict_rec = (struct ly_dict_rec *)rec->val;
        LOGWRN(NULL, "String \"%s\" not freed from the dictionary, refcount %" PRIu32 ".", dict_rec->value, dict_rec->refcount);
        /* if record wasn't removed before free string allocated for that record */
#ifdef NDEBUG
        free(dict_rec->value);
#endif
    }

    /* free table and destroy mutex */
    lyht_free(dict->hash_tab, NULL);
    pthread_mutex_destroy(&dict->lock);
}